

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDL::HalfLife::HL1MDLLoader::extract_anim_value
          (HL1MDLLoader *this,AnimValue_HL1 *panimvalue,int frame,float bone_scale,float *value)

{
  int local_2c;
  int k;
  float *value_local;
  float bone_scale_local;
  int frame_local;
  AnimValue_HL1 *panimvalue_local;
  HL1MDLLoader *this_local;
  
  local_2c = frame;
  for (_bone_scale_local = panimvalue; (int)(uint)(_bone_scale_local->num).total <= local_2c;
      _bone_scale_local = _bone_scale_local + (int)((_bone_scale_local->num).valid + 1)) {
    local_2c = local_2c - (uint)(_bone_scale_local->num).total;
  }
  if (local_2c < (int)(uint)(_bone_scale_local->num).valid) {
    *value = (float)(int)_bone_scale_local[local_2c + 1].value * bone_scale;
  }
  else {
    *value = (float)(int)_bone_scale_local[(_bone_scale_local->num).valid].value * bone_scale;
  }
  return;
}

Assistant:

void HL1MDLLoader::extract_anim_value(
        const AnimValue_HL1 *panimvalue,
        int frame, float bone_scale, float &value) {
    int k = frame;

    // find span of values that includes the frame we want
    while (panimvalue->num.total <= k) {
        k -= panimvalue->num.total;
        panimvalue += panimvalue->num.valid + 1;
    }

    // Bah, missing blend!
    if (panimvalue->num.valid > k)
        value = panimvalue[k + 1].value * bone_scale;
    else
        value = panimvalue[panimvalue->num.valid].value * bone_scale;
}